

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool XML_ParserReset(XML_Parser parser,XML_Char *encodingName)

{
  OPEN_INTERNAL_ENTITY *pOVar1;
  TAG *pTVar2;
  OPEN_INTERNAL_ENTITY *openEntity;
  TAG *tag;
  OPEN_INTERNAL_ENTITY *openEntityList;
  TAG *tStk;
  XML_Char *encodingName_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local._7_1_ = '\0';
  }
  else if (parser->m_parentParser == (XML_Parser)0x0) {
    openEntityList = (OPEN_INTERNAL_ENTITY *)parser->m_tagStack;
    while (openEntityList != (OPEN_INTERNAL_ENTITY *)0x0) {
      pOVar1 = (OPEN_INTERNAL_ENTITY *)openEntityList->internalEventPtr;
      openEntityList->internalEventPtr = (char *)parser->m_freeTagList;
      moveToFreeBindingList(parser,(BINDING *)openEntityList[2].internalEventPtr);
      openEntityList[2].internalEventPtr = (char *)0x0;
      parser->m_freeTagList = (TAG *)openEntityList;
      openEntityList = pOVar1;
    }
    tag = (TAG *)parser->m_openInternalEntities;
    while (tag != (TAG *)0x0) {
      pTVar2 = *(TAG **)&tag->rawNameLength;
      *(OPEN_INTERNAL_ENTITY **)&tag->rawNameLength = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)tag;
      tag = pTVar2;
    }
    moveToFreeBindingList(parser,parser->m_inheritedBindings);
    (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
    if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
      (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
    }
    poolClear(&parser->m_tempPool);
    poolClear(&parser->m_temp2Pool);
    (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
    parser->m_protocolEncodingName = (XML_Char *)0x0;
    parserInit(parser,encodingName);
    dtdReset(parser->m_dtd,&parser->m_mem);
    parser_local._7_1_ = '\x01';
  }
  else {
    parser_local._7_1_ = '\0';
  }
  return parser_local._7_1_;
}

Assistant:

XML_Bool XMLCALL
XML_ParserReset(XML_Parser parser, const XML_Char *encodingName)
{
  TAG *tStk;
  OPEN_INTERNAL_ENTITY *openEntityList;

  if (parser == NULL)
      return XML_FALSE;

  if (parser->m_parentParser)
    return XML_FALSE;
  /* move m_tagStack to m_freeTagList */
  tStk = parser->m_tagStack;
  while (tStk) {
    TAG *tag = tStk;
    tStk = tStk->parent;
    tag->parent = parser->m_freeTagList;
    moveToFreeBindingList(parser, tag->bindings);
    tag->bindings = NULL;
    parser->m_freeTagList = tag;
  }
  /* move m_openInternalEntities to m_freeInternalEntities */
  openEntityList = parser->m_openInternalEntities;
  while (openEntityList) {
    OPEN_INTERNAL_ENTITY *openEntity = openEntityList;
    openEntityList = openEntity->next;
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }
  moveToFreeBindingList(parser, parser->m_inheritedBindings);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  poolClear(&parser->m_tempPool);
  poolClear(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = NULL;
  parserInit(parser, encodingName);
  dtdReset(parser->m_dtd, &parser->m_mem);
  return XML_TRUE;
}